

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O0

void __thiscall CCEXP::CCEXPMat<int>::CCEXPMat(CCEXPMat<int> *this)

{
  unsigned_long uVar1;
  CCEXPMat<int> *this_local;
  
  CCEXPBase::CCEXPBase(&this->super_CCEXPBase);
  (this->super_CCEXPBase)._vptr_CCEXPBase = (_func_int **)&PTR__CCEXPMat_00165a48;
  this->IgnoreM = false;
  this->newRowFlag = true;
  std::vector<ns_MVECTOR::MVECTOR<int>,_std::allocator<ns_MVECTOR::MVECTOR<int>_>_>::vector
            (&this->data);
  uVar1 = std::numeric_limits<unsigned_long>::max();
  this->_maxRows = uVar1;
  return;
}

Assistant:

MVECTOR<T>* CCEXPMat<T>::getDataRowPtr(size_t row) {
	const size_t N = data.size();
	CECS_ERRN(CCEXPECS,row >= N,"CCEXPMat::getDataRowPtr():: Requested Row is not exist yet! (row(=" __ZU__ ") >= N(=" __ZU__ "))", row, N);
	MVECTOR<T>* pRow = nullptr;
	#ifdef __CCEXP__USE_VECTOR_INSTEAD_OF_LIST
		pRow = &data[row];
	#else
		auto it = std::next(data.begin(), row);
		pRow = &(*it);
	#endif
	CECS_ERRN(CCEXPECS, pRow == nullptr, "CCEXPMat::AppendRow():: pRow is nullptr");
	return pRow;
}